

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::unoptimizedPumpTo
          (kj *this,AsyncInputStream *input,AsyncOutputStream *output,uint64_t amount,
          uint64_t completedSoFar)

{
  PromiseArena *pPVar1;
  undefined8 *puVar2;
  void *pvVar3;
  AsyncPump *ptrCopy;
  AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AsyncPump,_std::nullptr_t>_> *location;
  Promise<unsigned_long> promise;
  undefined1 local_58 [16];
  undefined8 *local_48;
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AsyncPump,_std::nullptr_t>_>,_kj::_::PromiseDisposer>
  local_40;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  
  puVar2 = (undefined8 *)operator_new(0x1020);
  *puVar2 = input;
  puVar2[1] = output;
  puVar2[2] = amount;
  puVar2[3] = completedSoFar;
  anon_unknown_123::AsyncPump::pump((AsyncPump *)local_58);
  local_58._8_8_ = &_::HeapDisposer<kj::(anonymous_namespace)::AsyncPump>::instance;
  pPVar1 = ((PromiseArenaMember *)local_58._0_8_)->arena;
  local_48 = puVar2;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_58._0_8_ - (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    location = (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AsyncPump,_std::nullptr_t>_>
                *)((long)pvVar3 + 0x3d8);
    ctor<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AsyncPump,decltype(nullptr)>>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::Own<kj::(anonymous_namespace)::AsyncPump,decltype(nullptr)>>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_58,
               (Own<kj::(anonymous_namespace)::AsyncPump,_std::nullptr_t> *)(local_58 + 8));
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    ((PromiseArenaMember *)local_58._0_8_)->arena = (PromiseArena *)0x0;
    location = (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AsyncPump,_std::nullptr_t>_>
                *)&(((PromiseNode *)(local_58._0_8_ + -0x30))->super_PromiseArenaMember).arena;
    ctor<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AsyncPump,decltype(nullptr)>>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::Own<kj::(anonymous_namespace)::AsyncPump,decltype(nullptr)>>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_58,
               (Own<kj::(anonymous_namespace)::AsyncPump,_std::nullptr_t> *)(local_58 + 8));
    (((PromiseNode *)(local_58._0_8_ + -0x20))->super_PromiseArenaMember)._vptr_PromiseArenaMember =
         (_func_int **)pPVar1;
  }
  local_40.ptr = (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AsyncPump,_std::nullptr_t>_>
                  *)0x0;
  *(AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AsyncPump,_std::nullptr_t>_> **)this =
       location;
  local_38.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AsyncPump,_std::nullptr_t>_>,_kj::_::PromiseDisposer>
  ::~Own(&local_40);
  if (local_48 != (undefined8 *)0x0) {
    (***(_func_int ***)local_58._8_8_)();
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_58);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<uint64_t> unoptimizedPumpTo(
    AsyncInputStream& input, AsyncOutputStream& output, uint64_t amount,
    uint64_t completedSoFar) {
  auto pump = heap<AsyncPump>(input, output, amount, completedSoFar);
  auto promise = pump->pump();
  return promise.attach(kj::mv(pump));
}